

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::Sphere::Sample(Sphere *this,Point2f u)

{
  Point2f uv_00;
  Tuple3<pbrt::Vector3,_float> t;
  Tuple3<pbrt::Vector3,_float> t_00;
  Tuple3<pbrt::Vector3,_float> t_01;
  Normal3f n_00;
  undefined1 auVar1 [16];
  Point2f u_00;
  Point3f p;
  Point3<float> p2;
  undefined1 auVar2 [16];
  Point3<float> p1;
  Normal3<float> n_01;
  Sphere *in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  type tVar3;
  double dVar5;
  undefined8 uVar12;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  Vector3f VVar14;
  Vector3<float> VVar15;
  Point3<float> PVar16;
  Normal3<float> NVar17;
  Point3fi pi;
  Point2f uv;
  Float phi;
  Float theta;
  Normal3f n;
  Normal3f nObj;
  Vector3f pObjError;
  Point3f pObj;
  float in_stack_fffffffffffffc68;
  float in_stack_fffffffffffffc6c;
  Normal3<float> *in_stack_fffffffffffffc70;
  Transform *this_00;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  Interaction *this_01;
  float fVar18;
  float s;
  undefined4 in_stack_fffffffffffffc90;
  Float FVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float in_stack_fffffffffffffca4;
  float in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 uVar23;
  Float FVar24;
  undefined8 in_stack_fffffffffffffcc8;
  float in_stack_fffffffffffffcd0;
  undefined4 uStack_32c;
  undefined8 in_stack_fffffffffffffce8;
  float in_stack_fffffffffffffcf0;
  Transform *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  float in_stack_fffffffffffffd88;
  undefined1 local_258 [64];
  MediumInterface *local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  MediumInterface *local_1b8;
  float local_1b0;
  undefined8 local_1ac;
  undefined4 local_1a4;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  undefined4 local_168;
  ulong local_160;
  float local_158;
  ulong local_150;
  float local_148;
  undefined8 local_144;
  undefined4 local_13c;
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  ulong local_e8;
  float local_e0;
  undefined8 local_d4;
  undefined4 local_cc;
  ulong local_c8;
  float local_c0;
  ulong local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  ulong local_28;
  float local_20;
  undefined8 local_10;
  undefined8 uVar4;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  
  fVar18 = SUB84(in_RDI,0);
  s = (float)((ulong)in_RDI >> 0x20);
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar23 = 0;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
             in_stack_fffffffffffffc68,0.0);
  FVar19 = in_RSI->radius;
  local_68 = local_10;
  uVar12 = 0;
  u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffca8;
  u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffca4;
  VVar14 = SampleUniformSphere(u_00);
  local_80 = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar4 = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13 = (undefined1  [56])0x0;
  fVar20 = VVar14.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar21 = VVar14.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar22 = (float)uVar12;
  auVar1._8_4_ = fVar22;
  auVar1._0_8_ = uVar4;
  auVar1._12_4_ = (int)((ulong)uVar12 >> 0x20);
  local_88 = vmovlpd_avx(auVar1);
  t_00.z = fVar22;
  t_00.x = (float)(int)uVar4;
  t_00.y = (float)(int)((ulong)uVar4 >> 0x20);
  local_78 = local_88;
  local_70 = local_80;
  local_60 = local_88;
  local_58 = local_80;
  local_50 = local_88;
  local_48 = local_80;
  VVar15 = pbrt::operator*(s,t_00);
  local_a0 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar13;
  local_a8 = vmovlpd_avx(auVar7._0_16_);
  auVar13 = ZEXT856(0);
  VVar15.super_Tuple3<pbrt::Vector3,_float>.y = FVar19;
  VVar15.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc90;
  VVar15.super_Tuple3<pbrt::Vector3,_float>.z = fVar20;
  local_98 = local_a8;
  local_90 = local_a0;
  local_40 = local_a8;
  local_38 = local_a0;
  PVar16 = Point3<float>::operator+
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                      ,VVar15);
  local_c0 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  local_c8 = vmovlpd_avx(auVar8._0_16_);
  FVar24 = in_RSI->radius;
  local_b8 = local_c8;
  local_b0 = local_c0;
  local_28 = local_c8;
  local_20 = local_c0;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
             in_stack_fffffffffffffc68,0.0);
  local_e0 = local_c0;
  local_e8 = local_c8;
  local_f0 = local_cc;
  local_f8 = local_d4;
  p1.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffcf0;
  p1.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffce8;
  p1.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  p2.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffcd0;
  p2.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffcc8;
  p2.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  tVar3 = Distance<float>(p1,p2);
  auVar6._0_4_ = FVar24 / tVar3;
  auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
  dVar5 = auVar6._0_8_;
  Tuple3<pbrt::Point3,float>::operator*=((Tuple3<pbrt::Point3,float> *)&local_28,auVar6._0_4_);
  gamma(dVar5);
  local_148 = local_20;
  local_150 = local_28;
  local_158 = local_20;
  local_160 = local_28;
  PVar16.super_Tuple3<pbrt::Point3,_float>.y = fVar18;
  PVar16.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffc7c;
  PVar16.super_Tuple3<pbrt::Point3,_float>.z = s;
  Vector3<float>::Vector3<float>((Vector3<float> *)0x45b525,PVar16);
  local_130 = local_13c;
  local_138 = local_144;
  local_168 = local_13c;
  local_170 = local_144;
  uVar4 = 0;
  t.y = FVar19;
  t.x = (float)in_stack_fffffffffffffc90;
  t.z = fVar20;
  VVar15 = Abs<pbrt::Vector3,float>(t);
  local_188 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13 = (undefined1  [56])0x0;
  uStack_32c = (undefined4)((ulong)uVar4 >> 0x20);
  auVar2._8_4_ = (int)uVar4;
  auVar2._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._12_4_ = uStack_32c;
  local_190 = vmovlpd_avx(auVar2);
  t_01.y = fVar21;
  t_01.x = fVar20;
  t_01.z = fVar22;
  local_180 = local_190;
  local_178 = local_188;
  local_128 = local_190;
  local_120 = local_188;
  local_118 = local_190;
  local_110 = local_188;
  VVar15 = pbrt::operator*(s,t_01);
  local_198 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  local_1a0 = vmovlpd_avx(auVar9._0_16_);
  local_108 = local_1a0;
  local_100 = local_198;
  Normal3<float>::Normal3
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68,0.0);
  local_1d0 = local_1a4;
  local_1d8 = local_1ac;
  local_1e0 = local_1a4;
  local_1e8 = local_1ac;
  auVar13 = ZEXT856(0);
  n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffd84;
  n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffd80;
  n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffd88;
  NVar17 = Transform::operator()(in_stack_fffffffffffffd68,n_01);
  local_200 = NVar17.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar10._0_8_ = NVar17.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar10._8_56_ = auVar13;
  local_208 = vmovlpd_avx(auVar10._0_16_);
  auVar13 = ZEXT856(0);
  NVar17.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar23;
  NVar17.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffcb8;
  NVar17.super_Tuple3<pbrt::Normal3,_float>.z = FVar24;
  local_1f8 = local_208;
  local_1f0 = local_200;
  local_1c8 = local_208;
  local_1c0 = local_200;
  NVar17 = Normalize<float>(NVar17);
  local_210 = NVar17.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar11._0_8_ = NVar17.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar11._8_56_ = auVar13;
  local_218 = (MediumInterface *)vmovlpd_avx(auVar11._0_16_);
  local_1b8 = local_218;
  local_1b0 = local_210;
  if ((in_RSI->reverseOrientation & 1U) != 0) {
    Tuple3<pbrt::Normal3,float>::operator*=((Tuple3<pbrt::Normal3,float> *)&local_1b8,-1);
  }
  local_258._60_4_ = SafeACos(0.0);
  dVar5 = std::atan2((double)(local_28 >> 0x20),(double)(local_28 & 0xffffffff));
  local_258._56_4_ = SUB84(dVar5,0);
  if ((float)local_258._56_4_ < 0.0) {
    local_258._56_4_ = (float)local_258._56_4_ + 6.2831855;
  }
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
             in_stack_fffffffffffffc68);
  this_00 = in_RSI->renderFromObject;
  this_01 = (Interaction *)local_258;
  p.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar23;
  p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffcb8;
  p.super_Tuple3<pbrt::Point3,_float>.z = FVar24;
  VVar14.super_Tuple3<pbrt::Vector3,_float>.y = fVar21;
  VVar14.super_Tuple3<pbrt::Vector3,_float>.x = fVar20;
  VVar14.super_Tuple3<pbrt::Vector3,_float>.z = fVar22;
  Point3fi::Point3fi((Point3fi *)CONCAT44(s,fVar18),p,VVar14);
  Transform::operator()
            ((Transform *)
             pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,
             (Point3fi *)
             pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
  n_00.super_Tuple3<pbrt::Normal3,_float>.y = fVar21;
  n_00.super_Tuple3<pbrt::Normal3,_float>.x = fVar20;
  n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar22;
  uv_00.super_Tuple2<pbrt::Point2,_float>.y = s;
  uv_00.super_Tuple2<pbrt::Point2,_float>.x = fVar18;
  Interaction::Interaction(this_01,(Point3fi *)this_00,n_00,uv_00);
  Area(in_RSI);
  pstd::optional<pbrt::ShapeSample>::optional
            ((optional<pbrt::ShapeSample> *)this_00,
             (ShapeSample *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<ShapeSample> Sphere::Sample(Point2f u) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * SampleUniformSphere(u);
    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / Distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * Abs((Vector3f)pObj);

    // Compute surface normal for sphere sample and return _ShapeSample_
    Normal3f nObj(pObj.x, pObj.y, pObj.z);
    Normal3f n = Normalize((*renderFromObject)(nObj));
    if (reverseOrientation)
        n *= -1;
    // Compute $(u, v)$ coordinates for sphere sample
    Float theta = SafeACos(pObj.z / radius);
    Float phi = std::atan2(pObj.y, pObj.x);
    if (phi < 0)
        phi += 2 * Pi;
    Point2f uv(phi / phiMax, (theta - thetaZMin) / (thetaZMax - thetaZMin));

    Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
    return ShapeSample{Interaction(pi, n, uv), 1 / Area()};
}